

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<kratos::EventControl> * __thiscall
pybind11::class_<kratos::EventControl>::def_readwrite<kratos::EventControl,kratos::EventEdgeType>
          (class_<kratos::EventControl> *this,char *name,
          offset_in_IRNode_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pm)

{
  is_method local_48;
  is_method local_40;
  cpp_function local_38;
  cpp_function fget;
  cpp_function fset;
  
  fget.super_function.super_object.super_handle.m_ptr =
       (function)(this->super_generic_type).super_object.super_handle.m_ptr;
  local_40.class_.m_ptr = (handle)(handle)pm;
  cpp_function::
  cpp_function<pybind11::class_<kratos::EventControl>::def_readwrite<kratos::EventControl,kratos::EventEdgeType>(char_const*,kratos::EventEdgeType_kratos::EventControl::*)::_lambda(kratos::EventControl_const&)_1_,pybind11::is_method,void>
            (&local_38,(type *)&local_40,(is_method *)&fget);
  local_48.class_.m_ptr = (handle)(this->super_generic_type).super_object.super_handle.m_ptr;
  local_40.class_.m_ptr = (handle)(handle)pm;
  cpp_function::
  cpp_function<pybind11::class_<kratos::EventControl>::def_readwrite<kratos::EventControl,kratos::EventEdgeType>(char_const*,kratos::EventEdgeType_kratos::EventControl::*)::_lambda(kratos::EventControl&,kratos::EventEdgeType_const&)_1_,pybind11::is_method,void>
            (&fget,(type *)&local_40,&local_48);
  local_48.class_.m_ptr._0_1_ = 6;
  local_40.class_.m_ptr = (handle)(this->super_generic_type).super_object.super_handle.m_ptr;
  def_property_static<pybind11::is_method,pybind11::return_value_policy>
            (this,name,&local_38,&fget,&local_40,(return_value_policy *)&local_48);
  object::~object((object *)&fget);
  object::~object((object *)&local_38);
  return this;
}

Assistant:

class_ &def_readwrite(const char *name, D C::*pm, const Extra&... extra) {
        static_assert(std::is_same<C, type>::value || std::is_base_of<C, type>::value, "def_readwrite() requires a class member (or base class member)");
        cpp_function fget([pm](const type &c) -> const D &{ return c.*pm; }, is_method(*this)),
                     fset([pm](type &c, const D &value) { c.*pm = value; }, is_method(*this));
        def_property(name, fget, fset, return_value_policy::reference_internal, extra...);
        return *this;
    }